

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

int rank_c(double *A,int M,int N)

{
  int iVar1;
  double *U_00;
  double *V_00;
  double *q_00;
  double dVar2;
  double *q;
  double *V;
  double *U;
  double qmax;
  double szmax;
  double tol;
  double eps;
  int local_28;
  int ret;
  int rnk;
  int i;
  int N_local;
  int M_local;
  double *A_local;
  
  U_00 = (double *)malloc((long)M * 8 * (long)N);
  V_00 = (double *)malloc((long)N * 8 * (long)N);
  q_00 = (double *)malloc((long)N << 3);
  dVar2 = macheps();
  local_28 = 0;
  if (M < N) {
    qmax = (double)N;
  }
  else {
    qmax = (double)M;
  }
  iVar1 = svd(A,M,N,U_00,V_00,q_00);
  if (iVar1 == 0) {
    for (ret = 0; ret < N; ret = ret + 1) {
      if (*q_00 * qmax * dVar2 < q_00[ret]) {
        local_28 = local_28 + 1;
      }
    }
    free(U_00);
    free(V_00);
    free(q_00);
    A_local._4_4_ = local_28;
  }
  else {
    printf("Failed to Compute SVD");
    A_local._4_4_ = -1;
  }
  return A_local._4_4_;
}

Assistant:

static int rank_c(double *A, int M,int N) {
	int i,rnk,ret;
	double eps,tol,szmax,qmax;
	double *U,*V,*q;

	U = (double*) malloc(sizeof(double) * M*N);
	V = (double*) malloc(sizeof(double) * N*N);
	q = (double*) malloc(sizeof(double) * N);

	eps = macheps();
	rnk = 0;
	if (M < N) {
		//mtranspose(A,M,N,U);
		szmax = (double) N;
	} else {
		szmax = (double) M;
	}
	ret = svd(A,M,N,U,V,q);
	qmax = q[0];
	if ( ret != 0) {
		printf("Failed to Compute SVD");
		return -1;
	}

	tol = qmax*szmax *eps;

	for(i = 0; i < N;++i) {
		if (q[i] > tol) {
			rnk++;
		}
	}



	free(U);
	free(V);
	free(q);

	return rnk;
}